

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O3

string * __thiscall
booster::locale::impl_posix::utf8_converter::convert_abi_cxx11_
          (string *__return_storage_ptr__,utf8_converter *this,conversion_type how,char *begin,
          char *end,int param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  wstring wres;
  wstring tmp;
  string local_90;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  string local_50;
  
  if (how - lower_case < 2) {
    paVar1 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"UTF-8","");
    conv::to_utf<wchar_t>(&local_70,begin,end,&local_90,default_method);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_90._M_string_length = 0;
    local_90.field_2._M_allocated_capacity._0_4_ = 0;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::wstring::reserve((ulong)&local_90);
    if (local_70._M_string_length != 0) {
      uVar3 = 0;
      uVar4 = 1;
      do {
        towlower_l(local_70._M_dataplus._M_p[uVar3],
                   (__locale_t)
                   *(this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
        std::__cxx11::wstring::push_back((wchar_t)&local_90);
        bVar2 = uVar4 < local_70._M_string_length;
        uVar3 = uVar4;
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (bVar2);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"UTF-8","");
    conv::from_utf<wchar_t>
              (__return_storage_ptr__,(wchar_t *)local_90._M_dataplus._M_p,
               (wchar_t *)(local_90._M_dataplus._M_p + local_90._M_string_length * 4),&local_50,
               default_method);
  }
  else {
    if (how != upper_case) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,begin,end);
      return __return_storage_ptr__;
    }
    paVar1 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"UTF-8","");
    conv::to_utf<wchar_t>(&local_70,begin,end,&local_90,default_method);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_90._M_string_length = 0;
    local_90.field_2._M_allocated_capacity._0_4_ = 0;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::wstring::reserve((ulong)&local_90);
    if (local_70._M_string_length != 0) {
      uVar3 = 0;
      uVar4 = 1;
      do {
        towupper_l(local_70._M_dataplus._M_p[uVar3],
                   (__locale_t)
                   *(this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
        std::__cxx11::wstring::push_back((wchar_t)&local_90);
        bVar2 = uVar4 < local_70._M_string_length;
        uVar3 = uVar4;
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (bVar2);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"UTF-8","");
    conv::from_utf<wchar_t>
              (__return_storage_ptr__,(wchar_t *)local_90._M_dataplus._M_p,
               (wchar_t *)(local_90._M_dataplus._M_p + local_90._M_string_length * 4),&local_50,
               default_method);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string convert(converter_base::conversion_type how,char const *begin,char const *end,int /*flags*/ = 0) const 
    {
        switch(how) {
        case upper_case:
            {
                std::wstring tmp = conv::to_utf<wchar_t>(begin,end,"UTF-8");
                std::wstring wres;
                wres.reserve(tmp.size());
                for(unsigned i=0;i<tmp.size();i++)
                    wres+=towupper_l(tmp[i],*lc_);
                return conv::from_utf<wchar_t>(wres,"UTF-8");
            }
            
        case lower_case:
        case case_folding:
            {
                std::wstring tmp = conv::to_utf<wchar_t>(begin,end,"UTF-8");
                std::wstring wres;
                wres.reserve(tmp.size());
                for(unsigned i=0;i<tmp.size();i++)
                    wres+=towlower_l(tmp[i],*lc_);
                return conv::from_utf<wchar_t>(wres,"UTF-8");
            }
        default:
            return std::string(begin,end-begin);
        }
    }